

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O2

QList<QListWidgetItem_*> * __thiscall
QListWidget::selectedItems(QList<QListWidgetItem_*> *__return_storage_ptr__,QListWidget *this)

{
  QListWidgetPrivate *this_00;
  qsizetype qVar1;
  int iVar2;
  QListModel *pQVar3;
  ulong uVar4;
  QListWidgetItem *t;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<QModelIndex> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QListWidgetPrivate **)
             &(this->super_QListView).super_QAbstractItemView.super_QAbstractScrollArea.super_QFrame
              .super_QWidget.field_0x8;
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::selectionModel((QAbstractItemView *)this);
  QItemSelectionModel::selectedIndexes();
  qVar1 = local_48.size;
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QListWidgetItem **)0x0;
  iVar2 = (int)local_48.size;
  QList<QListWidgetItem_*>::reserve(__return_storage_ptr__,(long)iVar2);
  uVar5 = 0;
  uVar6 = qVar1 & 0xffffffff;
  if (iVar2 < 1) {
    uVar6 = uVar5;
  }
  for (; uVar6 * 0x18 - uVar5 != 0; uVar5 = uVar5 + 0x18) {
    pQVar3 = QListWidgetPrivate::listModel(this_00);
    uVar4 = (ulong)*(int *)((long)&(local_48.ptr)->r + uVar5);
    if (uVar4 < (ulong)(pQVar3->items).d.size) {
      t = (pQVar3->items).d.ptr[uVar4];
    }
    else {
      t = (parameter_type)0x0;
    }
    QList<QListWidgetItem_*>::append(__return_storage_ptr__,t);
  }
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QListWidgetItem*> QListWidget::selectedItems() const
{
    Q_D(const QListWidget);
    QModelIndexList indexes = selectionModel()->selectedIndexes();
    QList<QListWidgetItem*> items;
    const int numIndexes = indexes.size();
    items.reserve(numIndexes);
    for (int i = 0; i < numIndexes; ++i)
        items.append(d->listModel()->at(indexes.at(i).row()));
    return items;
}